

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double __thiscall pstore::logger::log(logger *this,double __x)

{
  long *plVar1;
  long *plVar2;
  char *in_RDX;
  uint in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar4;
  allocator local_61;
  long *local_60;
  long local_58;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string((string *)local_40,in_RDX,&local_61);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    uStack_48 = (undefined4)plVar1[3];
    uStack_44 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (*this->_vptr_logger[2])(this,(ulong)in_ESI);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
    uVar3 = extraout_XMM0_Da_00;
    uVar4 = extraout_XMM0_Db_00;
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    uVar3 = extraout_XMM0_Da_01;
    uVar4 = extraout_XMM0_Db_01;
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

void logger::log (priority const p, gsl::czstring const part1, gsl::czstring const part2) {
            this->log (p, std::string{part1} + part2);
        }